

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O0

void __thiscall cppcms::http::impl::file_buffer::~file_buffer(file_buffer *this)

{
  undefined8 *in_RDI;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  *in_RDI = &PTR__file_buffer_0052bfd0;
  if (in_RDI[9] != 0) {
    fclose((FILE *)in_RDI[9]);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0x1a));
  std::__cxx11::string::~string((string *)(in_RDI + 0x16));
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffff0);
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffff0);
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffff0);
  std::streambuf::~streambuf(in_RDI);
  return;
}

Assistant:

~file_buffer()
	{
		if(f_)
			fclose(f_);
	}